

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O2

void __thiscall QLocalServerPrivate::setError(QLocalServerPrivate *this,QString *function)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  uint *puVar4;
  ulong uVar5;
  SocketError SVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = (uint *)__errno_location();
  uVar5 = (ulong)*puVar4;
  if (uVar5 < 0x29) {
    if ((0x11040100004U >> (uVar5 & 0x3f) & 1) == 0) {
      if (uVar5 == 0xb) goto LAB_00227815;
      if (uVar5 != 0xd) goto LAB_002278bd;
      QLocalServer::tr((QString *)&local_70,"%1: Permission denied",(char *)0x0,-1);
      QString::arg<QString,_true>((QString *)&local_58,(QString *)&local_70,function,0,(QChar)0x20);
      pDVar2 = (this->errorString).d.d;
      pcVar3 = (this->errorString).d.ptr;
      (this->errorString).d.d = local_58.d;
      (this->errorString).d.ptr = local_58.ptr;
      qVar1 = (this->errorString).d.size;
      (this->errorString).d.size = local_58.size;
      local_58.d = pDVar2;
      local_58.ptr = pcVar3;
      local_58.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      SVar6 = SocketAccessError;
    }
    else {
      QLocalServer::tr((QString *)&local_70,"%1: Name error",(char *)0x0,-1);
      QString::arg<QString,_true>((QString *)&local_58,(QString *)&local_70,function,0,(QChar)0x20);
      pDVar2 = (this->errorString).d.d;
      pcVar3 = (this->errorString).d.ptr;
      (this->errorString).d.d = local_58.d;
      (this->errorString).d.ptr = local_58.ptr;
      qVar1 = (this->errorString).d.size;
      (this->errorString).d.size = local_58.size;
      local_58.d = pDVar2;
      local_58.ptr = pcVar3;
      local_58.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      SVar6 = HostNotFoundError;
    }
  }
  else {
LAB_002278bd:
    if (*puVar4 == 0x62) {
      QLocalServer::tr((QString *)&local_70,"%1: Address in use",(char *)0x0,-1);
      QString::arg<QString,_true>((QString *)&local_58,(QString *)&local_70,function,0,(QChar)0x20);
      pDVar2 = (this->errorString).d.d;
      pcVar3 = (this->errorString).d.ptr;
      (this->errorString).d.d = local_58.d;
      (this->errorString).d.ptr = local_58.ptr;
      qVar1 = (this->errorString).d.size;
      (this->errorString).d.size = local_58.size;
      local_58.d = pDVar2;
      local_58.ptr = pcVar3;
      local_58.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      SVar6 = AddressInUseError;
    }
    else {
      SVar6 = UnknownSocketError;
      QLocalServer::tr((QString *)&QStack_88,"%1: Unknown error %2",(char *)0x0,-1);
      QString::arg<QString,_true>((QString *)&local_70,(QString *)&QStack_88,function,0,(QChar)0x20)
      ;
      QString::arg<int,_true>((QString *)&local_58,(QString *)&local_70,*puVar4,0,10,(QChar)0x20);
      pDVar2 = (this->errorString).d.d;
      pcVar3 = (this->errorString).d.ptr;
      (this->errorString).d.d = local_58.d;
      (this->errorString).d.ptr = local_58.ptr;
      qVar1 = (this->errorString).d.size;
      (this->errorString).d.size = local_58.size;
      local_58.d = pDVar2;
      local_58.ptr = pcVar3;
      local_58.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_88);
    }
  }
  this->error = SVar6;
LAB_00227815:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLocalServerPrivate::setError(const QString &function)
{
    if (EAGAIN == errno)
        return;

    switch (errno) {
    case EACCES:
        errorString = QLocalServer::tr("%1: Permission denied").arg(function);
        error = QAbstractSocket::SocketAccessError;
        break;
    case ELOOP:
    case ENOENT:
    case ENAMETOOLONG:
    case EROFS:
    case ENOTDIR:
        errorString = QLocalServer::tr("%1: Name error").arg(function);
        error = QAbstractSocket::HostNotFoundError;
        break;
    case EADDRINUSE:
        errorString = QLocalServer::tr("%1: Address in use").arg(function);
        error = QAbstractSocket::AddressInUseError;
        break;

    default:
        errorString = QLocalServer::tr("%1: Unknown error %2")
                      .arg(function).arg(errno);
        error = QAbstractSocket::UnknownSocketError;
#if defined QLOCALSERVER_DEBUG
        qWarning() << errorString << "fullServerName:" << fullServerName;
#endif
    }
}